

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLoader.c
# Opt level: O0

DATA_LOADER * MemoryLoader_Init(UINT8 *buffer,UINT32 length)

{
  void *context;
  MEMORY_LOADER *mLoader;
  DATA_LOADER *dLoader;
  UINT32 length_local;
  UINT8 *buffer_local;
  
  buffer_local = (UINT8 *)calloc(1,0x28);
  if ((DATA_LOADER *)buffer_local == (DATA_LOADER *)0x0) {
    buffer_local = (UINT8 *)0x0;
  }
  else {
    context = calloc(1,0x90);
    if (context == (void *)0x0) {
      free(buffer_local);
      buffer_local = (UINT8 *)0x0;
    }
    else {
      *(UINT8 **)((long)context + 8) = buffer;
      *(UINT32 *)((long)context + 4) = length;
      *(undefined4 *)((long)context + 0x10) = 0;
      DataLoader_Setup((DATA_LOADER *)buffer_local,&memoryLoader,context);
    }
  }
  return (DATA_LOADER *)buffer_local;
}

Assistant:

DATA_LOADER *MemoryLoader_Init(const UINT8 *buffer, UINT32 length)
{
	DATA_LOADER *dLoader;
	MEMORY_LOADER *mLoader;

	dLoader = (DATA_LOADER *)calloc(1, sizeof(DATA_LOADER));
	if(dLoader == NULL) return NULL;

	mLoader = (MEMORY_LOADER *)calloc(1, sizeof(MEMORY_LOADER));
	if(mLoader == NULL)
	{
		free(dLoader);
		return NULL;
	}

	mLoader->srcData = buffer;
	mLoader->srcSize = length;
	mLoader->decSize = 0;

	DataLoader_Setup(dLoader,&memoryLoader,mLoader);

	return dLoader;
}